

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qevdevtouchhandler_p.cpp
# Opt level: O0

void QEvdevTouchScreenHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QEvdevTouchScreenHandler *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    touchPointsUpdated((QEvdevTouchScreenHandler *)0x11584f);
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QEvdevTouchScreenHandler::*)()>
              (in_RCX,(void **)touchPointsUpdated,0,0);
  }
  return;
}

Assistant:

void QEvdevTouchScreenHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QEvdevTouchScreenHandler *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->touchPointsUpdated(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QEvdevTouchScreenHandler::*)()>(_a, &QEvdevTouchScreenHandler::touchPointsUpdated, 0))
            return;
    }
}